

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::validateMemBytes
          (FunctionValidator *this,uint8_t bytes,Type type,Expression *curr)

{
  uchar right;
  BasicType BVar1;
  bool result;
  char *pcVar2;
  Type local_28;
  Type type_local;
  
  local_28.id = type.id;
  BVar1 = wasm::Type::getBasic(&local_28);
  switch(BVar1) {
  case none:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                       ,0x5fe);
  default:
    goto switchD_00a40036_caseD_1;
  case i32:
    result = bytes == '\x04' || (byte)(bytes - 1) < 2;
    pcVar2 = "expected i32 operation to touch 1, 2, or 4 bytes";
    goto LAB_00a400ac;
  case i64:
    result = (bool)((byte)(0x116 >> (bytes & 0x1f)) & bytes < 9);
    pcVar2 = "expected i64 operation to touch 1, 2, 4, or 8 bytes";
LAB_00a400ac:
    shouldBeTrue<wasm::Expression*>(this,result,curr,pcVar2);
    return;
  case f32:
    pcVar2 = "expected f32 operation to touch 4 bytes";
    right = '\x04';
    break;
  case f64:
    pcVar2 = "expected f64 operation to touch 8 bytes";
    right = '\b';
    break;
  case v128:
    pcVar2 = "expected v128 operation to touch 16 bytes";
    right = '\x10';
  }
  shouldBeEqual<wasm::Expression*,unsigned_char>(this,bytes,right,curr,pcVar2);
switchD_00a40036_caseD_1:
  return;
}

Assistant:

void FunctionValidator::validateMemBytes(uint8_t bytes,
                                         Type type,
                                         Expression* curr) {
  switch (type.getBasic()) {
    case Type::i32:
      shouldBeTrue(bytes == 1 || bytes == 2 || bytes == 4,
                   curr,
                   "expected i32 operation to touch 1, 2, or 4 bytes");
      break;
    case Type::i64:
      shouldBeTrue(bytes == 1 || bytes == 2 || bytes == 4 || bytes == 8,
                   curr,
                   "expected i64 operation to touch 1, 2, 4, or 8 bytes");
      break;
    case Type::f32:
      shouldBeEqual(
        bytes, uint8_t(4), curr, "expected f32 operation to touch 4 bytes");
      break;
    case Type::f64:
      shouldBeEqual(
        bytes, uint8_t(8), curr, "expected f64 operation to touch 8 bytes");
      break;
    case Type::v128:
      shouldBeEqual(
        bytes, uint8_t(16), curr, "expected v128 operation to touch 16 bytes");
      break;
    case Type::unreachable:
      break;
    case Type::none:
      WASM_UNREACHABLE("unexpected type");
  }
}